

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas.cpp
# Opt level: O0

CompressionFunction * duckdb::GetPatasFunction<double>(PhysicalType data_type)

{
  PhysicalType in_SIL;
  CompressionFunction *in_RDI;
  
  CompressionFunction::CompressionFunction
            (in_RDI,COMPRESSION_PATAS,in_SIL,PatasInitAnalyze<double>,PatasAnalyze<double>,
             PatasFinalAnalyze<double>,PatasInitCompression<double>,PatasCompress<double>,
             PatasFinalizeCompress<double>,PatasInitScan<double>,PatasScan<double>,
             PatasScanPartial<double>,PatasFetchRow<double>,PatasSkip<double>,
             (compression_init_segment_t)0x0,(compression_init_append_t)0x0,
             (compression_append_t)0x0,(compression_finalize_append_t)0x0,
             (compression_revert_append_t)0x0,(compression_serialize_state_t)0x0,
             (compression_deserialize_state_t)0x0,(compression_cleanup_state_t)0x0,
             (compression_init_prefetch_t)0x0,(compression_select_t)0x0,(compression_filter_t)0x0);
  return in_RDI;
}

Assistant:

CompressionFunction GetPatasFunction<double>(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_PATAS, data_type, PatasInitAnalyze<double>,
	                           PatasAnalyze<double>, PatasFinalAnalyze<double>, PatasInitCompression<double>,
	                           PatasCompress<double>, PatasFinalizeCompress<double>, PatasInitScan<double>,
	                           PatasScan<double>, PatasScanPartial<double>, PatasFetchRow<double>, PatasSkip<double>);
}